

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::DisjunctionPass0
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,int depth)

{
  EncodedChar EVar1;
  
  while( true ) {
    AlternativePass0(this,depth);
    EVar1 = ECLookahead(this,0);
    if (EVar1 != L'|') break;
    ECConsume(this,1);
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::DisjunctionPass0(int depth)
    {
        AlternativePass0(depth);
        while (true)
        {
            // Could be terminating 0
            if (ECLookahead() != '|')
                return;
            ECConsume();
            AlternativePass0(depth);
        }
    }